

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void __thiscall duckdb::FSSTScanState::FSSTScanState(FSSTScanState *this,idx_t string_block_limit)

{
  pointer *__ptr;
  
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__StringScanState_019a53f0;
  BufferHandle::BufferHandle(&(this->super_StringScanState).handle);
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__FSSTScanState_019a67e0;
  this->last_known_index = 0;
  (this->duckdb_fsst_decoder).internal.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->duckdb_fsst_decoder).internal.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->duckdb_fsst_decoder_ptr = (void *)0x0;
  (this->decompress_buffer).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->decompress_buffer).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->decompress_buffer).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bitunpack_buffer).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
  _M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
  this->bitunpack_buffer_capacity = 0;
  (this->delta_decode_buffer).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
  ._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
  this->delta_decode_capacity = 0;
  this->all_values_inlined = false;
  this->last_known_row = -1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->decompress_buffer).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             string_block_limit + 1);
  return;
}

Assistant:

explicit FSSTScanState(const idx_t string_block_limit) {
		ResetStoredDelta();
		decompress_buffer.resize(string_block_limit + 1);
	}